

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileTargetGenerator::GetDeviceLinkFlags
          (cmMakefileTargetGenerator *this,string *linkFlags,string *linkLanguage)

{
  cmGeneratorTarget *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkOpts;
  DeviceLinkSetter setter;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  DeviceLinkSetter local_50;
  string local_40;
  
  cmGeneratorTarget::DeviceLinkSetter::DeviceLinkSetter
            (&local_50,(this->super_cmCommonTargetGenerator).GeneratorTarget);
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_(&local_40,this);
  cmGeneratorTarget::GetLinkOptions(this_00,&local_68,&local_40,linkLanguage);
  std::__cxx11::string::~string((string *)&local_40);
  cmOutputConverter::SetLinkScriptShell
            ((cmOutputConverter *)this->LocalGenerator,
             (this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
             UseLinkScript);
  cmLocalGenerator::AppendCompileOptions
            ((cmLocalGenerator *)this->LocalGenerator,linkFlags,&local_68,(char *)0x0);
  cmOutputConverter::SetLinkScriptShell((cmOutputConverter *)this->LocalGenerator,false);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  cmGeneratorTarget::DeviceLinkSetter::~DeviceLinkSetter(&local_50);
  return;
}

Assistant:

void cmMakefileTargetGenerator::GetDeviceLinkFlags(
  std::string& linkFlags, const std::string& linkLanguage)
{
  cmGeneratorTarget::DeviceLinkSetter setter(*this->GetGeneratorTarget());

  std::vector<std::string> linkOpts;
  this->GeneratorTarget->GetLinkOptions(linkOpts, this->GetConfigName(),
                                        linkLanguage);
  this->LocalGenerator->SetLinkScriptShell(
    this->GlobalGenerator->GetUseLinkScript());
  // LINK_OPTIONS are escaped.
  this->LocalGenerator->AppendCompileOptions(linkFlags, linkOpts);
  this->LocalGenerator->SetLinkScriptShell(false);
}